

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_interval_recorder.c
# Opt level: O0

int hdr_interval_recorder_init_all
              (hdr_interval_recorder *r,int64_t lowest_discernible_value,
              int64_t highest_trackable_value,int significant_figures)

{
  int local_2c;
  int result;
  int significant_figures_local;
  int64_t highest_trackable_value_local;
  int64_t lowest_discernible_value_local;
  hdr_interval_recorder *r_local;
  
  r->inactive = (hdr_histogram *)0x0;
  r->active = (hdr_histogram *)0x0;
  local_2c = hdr_writer_reader_phaser_init(&r->phaser);
  if (local_2c == 0) {
    local_2c = hdr_init(lowest_discernible_value,highest_trackable_value,significant_figures,
                        &r->active);
  }
  return local_2c;
}

Assistant:

int hdr_interval_recorder_init_all(
    struct hdr_interval_recorder* r,
    int64_t lowest_discernible_value,
    int64_t highest_trackable_value,
    int significant_figures)
{
    int result;

    r->active = r->inactive = NULL;
    result = hdr_writer_reader_phaser_init(&r->phaser);
    result = result == 0
        ? hdr_init(lowest_discernible_value, highest_trackable_value, significant_figures, &r->active)
        : result;

    return result;
}